

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O1

size_t file_stdio_fread(ALLEGRO_FILE *f,void *ptr,size_t size)

{
  int iVar1;
  undefined8 *puVar2;
  int *piVar3;
  size_t sVar4;
  
  puVar2 = (undefined8 *)al_get_file_userdata(f);
  if (size == 1) {
    iVar1 = fgetc((FILE *)*puVar2);
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      *(int *)(puVar2 + 1) = *piVar3;
      al_set_errno(*piVar3);
      sVar4 = 0;
    }
    else {
      *(char *)ptr = (char)iVar1;
      sVar4 = 1;
    }
  }
  else {
    sVar4 = fread(ptr,1,size,(FILE *)*puVar2);
    if (sVar4 < size) {
      piVar3 = __errno_location();
      *(int *)(puVar2 + 1) = *piVar3;
      al_set_errno(*piVar3);
    }
  }
  return sVar4;
}

Assistant:

static size_t file_stdio_fread(ALLEGRO_FILE *f, void *ptr, size_t size)
{
   USERDATA *userdata = get_userdata(f);

   if (size == 1) {
      /* Optimise common case. */
      int c = fgetc(userdata->fp);
      if (c == EOF) {
         userdata->errnum = errno;
         al_set_errno(errno);
         return 0;
      }
      *((char *)ptr) = (char)c;
      return 1;
   }
   else {
      size_t ret = fread(ptr, 1, size, userdata->fp);
      if (ret < size) {
         userdata->errnum = errno;
         al_set_errno(errno);
      }
      return ret;
   }
}